

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenDDLParserTest.cpp
# Opt level: O0

void __thiscall
ODDLParser::OpenDDLParserTest_popTest_Test::TestBody(OpenDDLParserTest_popTest_Test *this)

{
  bool bVar1;
  char *pcVar2;
  DDLNode *pDVar3;
  AssertHelper local_288;
  Message local_280;
  undefined1 local_278 [8];
  AssertionResult gtest_ar_7;
  Message local_260;
  undefined1 local_258 [8];
  AssertionResult gtest_ar_6;
  Message local_240;
  undefined1 local_238 [8];
  AssertionResult gtest_ar_5;
  Message local_220;
  undefined1 local_218 [8];
  AssertionResult gtest_ar_4;
  Message local_200;
  undefined1 local_1f8 [8];
  AssertionResult gtest_ar_3;
  string local_1e0;
  allocator<char> local_1b9;
  string local_1b8;
  DDLNode *local_198;
  DDLNode *node3;
  Message local_188;
  undefined1 local_180 [8];
  AssertionResult gtest_ar_2;
  string local_168;
  allocator<char> local_141;
  string local_140;
  DDLNode *local_120;
  DDLNode *node2;
  Message local_110;
  undefined1 local_108 [8];
  AssertionResult gtest_ar_1;
  string local_f0;
  allocator<char> local_c9;
  string local_c8;
  DDLNode *local_a8;
  DDLNode *node1;
  Message local_98;
  undefined1 local_90 [8];
  AssertionResult gtest_ar;
  DDLNode *local_70;
  DDLNode *current;
  OpenDDLParser theParser;
  OpenDDLParserTest_popTest_Test *this_local;
  
  theParser.m_context = (Context *)this;
  OpenDDLParser::OpenDDLParser((OpenDDLParser *)&current);
  local_70 = OpenDDLParser::top((OpenDDLParser *)&current);
  testing::internal::EqHelper<true>::Compare<ODDLParser::DDLNode>
            ((EqHelper<true> *)local_90,"nullptr","current",(Secret *)0x0,local_70);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_90);
  if (!bVar1) {
    testing::Message::Message(&local_98);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_90);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&node1,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/kimkulling[P]openddl-parser/test/OpenDDLParserTest.cpp"
               ,0x306,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&node1,&local_98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&node1);
    testing::Message::~Message(&local_98);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_90);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_c8,"test1",&local_c9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f0,"",(allocator<char> *)((long)&gtest_ar_1.message_.ptr_ + 7));
  pDVar3 = DDLNode::create(&local_c8,&local_f0,(DDLNode *)0x0);
  std::__cxx11::string::~string((string *)&local_f0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_ar_1.message_.ptr_ + 7));
  std::__cxx11::string::~string((string *)&local_c8);
  std::allocator<char>::~allocator(&local_c9);
  local_a8 = pDVar3;
  OpenDDLParser::pushNode((OpenDDLParser *)&current,pDVar3);
  local_70 = OpenDDLParser::top((OpenDDLParser *)&current);
  testing::internal::EqHelper<false>::Compare<ODDLParser::DDLNode*,ODDLParser::DDLNode*>
            ((EqHelper<false> *)local_108,"node1","current",&local_a8,&local_70);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_108);
  if (!bVar1) {
    testing::Message::Message(&local_110);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_108);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&node2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/kimkulling[P]openddl-parser/test/OpenDDLParserTest.cpp"
               ,0x30b,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&node2,&local_110);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&node2);
    testing::Message::~Message(&local_110);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_108);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_140,"test2",&local_141);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_168,"",(allocator<char> *)((long)&gtest_ar_2.message_.ptr_ + 7));
  pDVar3 = DDLNode::create(&local_140,&local_168,(DDLNode *)0x0);
  std::__cxx11::string::~string((string *)&local_168);
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_ar_2.message_.ptr_ + 7));
  std::__cxx11::string::~string((string *)&local_140);
  std::allocator<char>::~allocator(&local_141);
  local_120 = pDVar3;
  OpenDDLParser::pushNode((OpenDDLParser *)&current,pDVar3);
  local_70 = OpenDDLParser::top((OpenDDLParser *)&current);
  testing::internal::EqHelper<false>::Compare<ODDLParser::DDLNode*,ODDLParser::DDLNode*>
            ((EqHelper<false> *)local_180,"node2","current",&local_120,&local_70);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_180);
  if (!bVar1) {
    testing::Message::Message(&local_188);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_180);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&node3,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/kimkulling[P]openddl-parser/test/OpenDDLParserTest.cpp"
               ,0x310,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&node3,&local_188);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&node3);
    testing::Message::~Message(&local_188);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_180);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1b8,"test3",&local_1b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1e0,"",(allocator<char> *)((long)&gtest_ar_3.message_.ptr_ + 7));
  pDVar3 = DDLNode::create(&local_1b8,&local_1e0,(DDLNode *)0x0);
  std::__cxx11::string::~string((string *)&local_1e0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_ar_3.message_.ptr_ + 7));
  std::__cxx11::string::~string((string *)&local_1b8);
  std::allocator<char>::~allocator(&local_1b9);
  local_198 = pDVar3;
  OpenDDLParser::pushNode((OpenDDLParser *)&current,pDVar3);
  local_70 = OpenDDLParser::top((OpenDDLParser *)&current);
  testing::internal::EqHelper<false>::Compare<ODDLParser::DDLNode*,ODDLParser::DDLNode*>
            ((EqHelper<false> *)local_1f8,"node3","current",&local_198,&local_70);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1f8);
  if (!bVar1) {
    testing::Message::Message(&local_200);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1f8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/kimkulling[P]openddl-parser/test/OpenDDLParserTest.cpp"
               ,0x315,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_200);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
    testing::Message::~Message(&local_200);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1f8);
  local_70 = OpenDDLParser::popNode((OpenDDLParser *)&current);
  testing::internal::EqHelper<false>::Compare<ODDLParser::DDLNode*,ODDLParser::DDLNode*>
            ((EqHelper<false> *)local_218,"node3","current",&local_198,&local_70);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_218);
  if (!bVar1) {
    testing::Message::Message(&local_220);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_218);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/kimkulling[P]openddl-parser/test/OpenDDLParserTest.cpp"
               ,0x318,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,&local_220);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
    testing::Message::~Message(&local_220);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_218);
  local_70 = OpenDDLParser::popNode((OpenDDLParser *)&current);
  testing::internal::EqHelper<false>::Compare<ODDLParser::DDLNode*,ODDLParser::DDLNode*>
            ((EqHelper<false> *)local_238,"node2","current",&local_120,&local_70);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_238);
  if (!bVar1) {
    testing::Message::Message(&local_240);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_238);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_6.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/kimkulling[P]openddl-parser/test/OpenDDLParserTest.cpp"
               ,0x31a,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6.message_,&local_240);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
    testing::Message::~Message(&local_240);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_238);
  local_70 = OpenDDLParser::popNode((OpenDDLParser *)&current);
  testing::internal::EqHelper<false>::Compare<ODDLParser::DDLNode*,ODDLParser::DDLNode*>
            ((EqHelper<false> *)local_258,"node1","current",&local_a8,&local_70);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_258);
  if (!bVar1) {
    testing::Message::Message(&local_260);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_258);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_7.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/kimkulling[P]openddl-parser/test/OpenDDLParserTest.cpp"
               ,0x31c,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_7.message_,&local_260);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7.message_);
    testing::Message::~Message(&local_260);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_258);
  local_70 = OpenDDLParser::top((OpenDDLParser *)&current);
  testing::internal::EqHelper<true>::Compare<ODDLParser::DDLNode>
            ((EqHelper<true> *)local_278,"nullptr","current",(Secret *)0x0,local_70);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_278);
  if (!bVar1) {
    testing::Message::Message(&local_280);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_278);
    testing::internal::AssertHelper::AssertHelper
              (&local_288,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/kimkulling[P]openddl-parser/test/OpenDDLParserTest.cpp"
               ,799,pcVar2);
    testing::internal::AssertHelper::operator=(&local_288,&local_280);
    testing::internal::AssertHelper::~AssertHelper(&local_288);
    testing::Message::~Message(&local_280);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_278);
  pDVar3 = local_a8;
  if (local_a8 != (DDLNode *)0x0) {
    DDLNode::~DDLNode(local_a8);
    operator_delete(pDVar3,0x88);
  }
  pDVar3 = local_120;
  if (local_120 != (DDLNode *)0x0) {
    DDLNode::~DDLNode(local_120);
    operator_delete(pDVar3,0x88);
  }
  pDVar3 = local_198;
  if (local_198 != (DDLNode *)0x0) {
    DDLNode::~DDLNode(local_198);
    operator_delete(pDVar3,0x88);
  }
  OpenDDLParser::~OpenDDLParser((OpenDDLParser *)&current);
  return;
}

Assistant:

TEST_F(OpenDDLParserTest, popTest) {
    OpenDDLParser theParser;

    DDLNode *current = theParser.top();
    EXPECT_EQ(nullptr, current);

    DDLNode *node1 = DDLNode::create("test1", "", nullptr);
    theParser.pushNode(node1);
    current = theParser.top();
    EXPECT_EQ(node1, current);

    DDLNode *node2 = DDLNode::create("test2", "", nullptr);
    theParser.pushNode(node2);
    current = theParser.top();
    EXPECT_EQ(node2, current);

    DDLNode *node3 = DDLNode::create("test3", "", nullptr);
    theParser.pushNode(node3);
    current = theParser.top();
    EXPECT_EQ(node3, current);

    current = theParser.popNode();
    EXPECT_EQ(node3, current);
    current = theParser.popNode();
    EXPECT_EQ(node2, current);
    current = theParser.popNode();
    EXPECT_EQ(node1, current);

    current = theParser.top();
    EXPECT_EQ(nullptr, current);
    delete node1;
    delete node2;
    delete node3;
}